

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O1

void Gia_Sim2Delete(Gia_Sim2_t *p)

{
  int *piVar1;
  
  if (p->vClassOld != (Vec_Int_t *)0x0) {
    piVar1 = p->vClassOld->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vClassOld->pArray = (int *)0x0;
    }
    if (p->vClassOld != (Vec_Int_t *)0x0) {
      free(p->vClassOld);
      p->vClassOld = (Vec_Int_t *)0x0;
    }
  }
  if (p->vClassNew != (Vec_Int_t *)0x0) {
    piVar1 = p->vClassNew->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vClassNew->pArray = (int *)0x0;
    }
    if (p->vClassNew != (Vec_Int_t *)0x0) {
      free(p->vClassNew);
      p->vClassNew = (Vec_Int_t *)0x0;
    }
  }
  if (p->pDataSim != (uint *)0x0) {
    free(p->pDataSim);
    p->pDataSim = (uint *)0x0;
  }
  if (p != (Gia_Sim2_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Gia_Sim2Delete( Gia_Sim2_t * p )
{
    Vec_IntFreeP( &p->vClassOld );
    Vec_IntFreeP( &p->vClassNew );
    ABC_FREE( p->pDataSim );
    ABC_FREE( p );
}